

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSTLUtil.hpp
# Opt level: O1

bool de::
     insert<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *map,key_type *key,mapped_type_conflict *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar3;
  value_type entry;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_48;
  
  paVar1 = &local_48.first.field_2;
  pcVar2 = (key->_M_dataplus)._M_p;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + key->_M_string_length);
  local_48.second = *value;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string_const,int>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)map,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool insert (M& map, const typename M::key_type& key, const typename M::mapped_type& value)
{
	typename M::value_type entry(key, value);
	std::pair<typename M::iterator,bool> ret = map.insert(entry);
	return ret.second;
}